

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O1

string * __thiscall
Diligent::
FormatString<char[41],char[15],unsigned_int,char[11],unsigned_int,char[27],unsigned_long,char[19],unsigned_long,char[36],unsigned_long,char[2]>
          (string *__return_storage_ptr__,Diligent *this,char (*Args) [41],char (*Args_1) [15],
          uint *Args_2,char (*Args_3) [11],uint *Args_4,char (*Args_5) [27],unsigned_long *Args_6,
          char (*Args_7) [19],unsigned_long *Args_8,char (*Args_9) [36],unsigned_long *Args_10,
          char (*Args_11) [2])

{
  stringstream ss;
  stringstream local_1b8 [128];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  FormatStrSS<std::__cxx11::stringstream,char[41],char[15],unsigned_int,char[11],unsigned_int,char[27],unsigned_long,char[19],unsigned_long,char[36],unsigned_long,char[2]>
            ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
             (char (*) [41])this,(char (*) [15])Args,(uint *)Args_1,(char (*) [11])Args_2,
             (uint *)Args_3,(char (*) [27])Args_4,(unsigned_long *)Args_5,(char (*) [19])Args_6,
             (unsigned_long *)Args_7,(char (*) [36])Args_8,(unsigned_long *)Args_9,
             (char (*) [2])Args_10);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatString(const RestArgsType&... Args)
{
    std::stringstream ss;
    FormatStrSS(ss, Args...);
    return ss.str();
}